

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O3

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  *(code **)this = _ITM_deregisterTMCloneTable;
  if (*(CppGenerator **)(this + 0x10) != this + 0x20) {
    operator_delete(*(CppGenerator **)(this + 0x10),*(long *)(this + 0x20) + 1);
  }
  google::protobuf::compiler::CodeGenerator::~CodeGenerator((CodeGenerator *)this);
  return;
}

Assistant:

~CppGenerator() override = default;